

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  int nSegment;
  Fts3SegReader **ppFVar1;
  long lVar2;
  int iVar3;
  Fts3SegReader *pReader;
  int iVar4;
  long lVar5;
  int nSuspect;
  bool bVar6;
  int nList;
  char *pList;
  int local_70;
  int local_6c;
  char *local_68;
  char **local_60;
  Fts3MultiSegReader *local_58;
  Fts3Table *local_50;
  long *local_48;
  int *local_40;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_38;
  
  nSegment = pMsr->nAdvance;
  local_38 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_38 = fts3SegReaderDoclistCmp;
  }
  if ((long)nSegment == 0) {
    *paPoslist = (char *)0x0;
  }
  else {
    ppFVar1 = pMsr->apSegment;
    local_60 = paPoslist;
    local_58 = pMsr;
    local_50 = p;
    local_48 = piDocid;
    local_40 = pnPoslist;
    do {
      if ((*pMsr->apSegment)->pOffsetList == (char *)0x0) {
        *local_60 = (char *)0x0;
        iVar4 = 3;
        iVar3 = local_70;
      }
      else {
        lVar2 = (*ppFVar1)->iDocid;
        iVar3 = fts3SegReaderNextDocid(local_50,*ppFVar1,&local_68,&local_6c);
        bVar6 = iVar3 == 0;
        iVar4 = 1;
        if ((bVar6 && 1 < nSegment) && (pReader = ppFVar1[1], pReader->pOffsetList != (char *)0x0))
        {
          nSuspect = 1;
          lVar5 = 2;
          while (pReader->iDocid == lVar2) {
            iVar3 = fts3SegReaderNextDocid(local_50,pReader,(char **)0x0,(int *)0x0);
            nSuspect = nSuspect + 1;
            bVar6 = iVar3 == 0;
            if ((!bVar6) || (nSegment <= lVar5)) break;
            pReader = ppFVar1[lVar5];
            lVar5 = lVar5 + 1;
            if (pReader->pOffsetList == (char *)0x0) break;
          }
        }
        else {
          nSuspect = 1;
        }
        pMsr = local_58;
        if (bVar6) {
          fts3SegReaderSort(local_58->apSegment,nSegment,nSuspect,local_38);
          if ((0 < local_6c) && ((*ppFVar1)->ppNextElem != (Fts3HashElem **)0x0)) {
            iVar3 = fts3MsrBufferData(pMsr,local_68,local_6c + 1);
            if (iVar3 != 0) goto LAB_001d4a10;
            local_68 = pMsr->aBuffer;
          }
          if (-1 < pMsr->iColFilter) {
            fts3ColumnFilter(pMsr->iColFilter,1,&local_68,&local_6c);
          }
          if (local_6c < 1) {
            iVar4 = 0;
            iVar3 = local_70;
          }
          else {
            *local_60 = local_68;
            *local_48 = lVar2;
            *local_40 = local_6c;
            iVar4 = 3;
            iVar3 = local_70;
          }
        }
      }
LAB_001d4a10:
      local_70 = iVar3;
    } while (iVar4 == 0);
    if (iVar4 != 3) {
      return local_70;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK 
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}